

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_decoder.h
# Opt level: O0

LumaFrame * __thiscall LumaDecoder::decode(LumaDecoder *this)

{
  ulong uVar1;
  EVP_PKEY_CTX *in_RSI;
  LumaDecoder *this_local;
  
  uVar1 = (**(code **)(*(long *)this + 8))();
  if ((uVar1 & 1) == 0) {
    this_local = (LumaDecoder *)0x0;
  }
  else {
    if (*(int *)(this + 0x264) == 0) {
      *(undefined4 *)(this + 0x264) = *(undefined4 *)(*(long *)(this + 0x2b0) + 0x18);
      *(undefined4 *)(this + 0x260) = *(undefined4 *)(*(long *)(this + 0x2b0) + 0x1c);
      *(undefined4 *)(this + 0x268) = 3;
      LumaFrame::init((LumaFrame *)(this + 0x260),in_RSI);
    }
    LumaDecoder::getVpxChannels();
    LumaQuantizer::transformColorSpace
              ((LumaFrame *)(this + 0x18),(bool)((char)this + '`'),*(float *)(this + 0x2c0));
    this_local = this + 0x260;
  }
  return (LumaFrame *)this_local;
}

Assistant:

LumaFrame *decode()
    {
        if (!run())
            return NULL;
            
        if (!m_frame.width)
        {
            m_frame.width = m_vpxFrame->d_w;
            m_frame.height = m_vpxFrame->d_h;
            m_frame.channels = 3;
            m_frame.init();
        }
        
	    getVpxChannels();
        
        m_quant.transformColorSpace(&m_frame, false, m_params.preScaling);
        
        return &m_frame;
    }